

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# EventLoop.cpp
# Opt level: O3

void __thiscall brynet::net::EventLoop::pushAsyncProc(EventLoop *this,USER_PROC *f)

{
  int iVar1;
  THREAD_ID_TYPE *pTVar2;
  
  iVar1 = this->mSelfThreadID;
  pTVar2 = CurrentThread::tid();
  if (iVar1 != *pTVar2) {
    iVar1 = pthread_mutex_lock((pthread_mutex_t *)&this->mAsyncProcsMutex);
    if (iVar1 == 0) {
      std::vector<std::function<void()>,std::allocator<std::function<void()>>>::
      emplace_back<std::function<void()>>
                ((vector<std::function<void()>,std::allocator<std::function<void()>>> *)
                 &this->mAsyncProcs,f);
      pthread_mutex_unlock((pthread_mutex_t *)&this->mAsyncProcsMutex);
      wakeup(this);
      return;
    }
    std::__throw_system_error(iVar1);
  }
  if ((f->super__Function_base)._M_manager != (_Manager_type)0x0) {
    (*f->_M_invoker)((_Any_data *)f);
    return;
  }
  std::__throw_bad_function_call();
}

Assistant:

void EventLoop::pushAsyncProc(USER_PROC f)
{
    if (isInLoopThread())
    {
        f();
    }
    else
    {
        {
            std::lock_guard<std::mutex> lck(mAsyncProcsMutex);
            mAsyncProcs.emplace_back(std::move(f));
        }
        wakeup();
    }
}